

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_91935b::HandleCopyFile
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  CopyResult CVar4;
  size_type sVar5;
  const_reference pvVar6;
  cmMakefile *pcVar7;
  string *psVar8;
  cmArgumentParser<Arguments> *pcVar9;
  cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *this;
  reference __rhs;
  ulong uVar10;
  static_string_view sVar11;
  string local_2d8;
  string_view local_2b8;
  string_view local_2a8;
  undefined1 local_298 [8];
  string err;
  CopyInputRecent inputRecent;
  CopyWhen when;
  string_view local_250;
  string local_240;
  string_view local_220;
  byte local_20d;
  undefined4 local_20c;
  undefined1 local_208 [3];
  bool result;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1e8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1d8;
  undefined1 local_1c8 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmArgumentParser<Arguments> local_158;
  char local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string newname;
  string local_98;
  undefined1 local_78 [8];
  string oldname;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"COPY_FILE must be called with at least two additional arguments"
               ,&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    std::__cxx11::string::string((string *)local_78,(string *)pvVar6);
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_78);
    if (!bVar2) {
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar7);
      newname.field_2._M_local_buf[0xf] = '/';
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,1);
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_98,psVar8,newname.field_2._M_local_buf + 0xf,pvVar6);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    std::__cxx11::string::string((string *)local_c0,(string *)pvVar6);
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_c0);
    if (!bVar2) {
      pcVar7 = cmExecutionStatus::GetMakefile(local_20);
      psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar7);
      local_e1 = '/';
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_e0,psVar8,&local_e1,pvVar6);
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    if (((anonymous_namespace)::
         HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::parser == '\0') &&
       (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::parser), iVar3 != 0)) {
      local_158.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
      local_158.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
      local_158.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_158.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
      local_158.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_158.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
      local_158.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      local_158.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      local_158.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cmArgumentParser<Arguments>::cmArgumentParser(&local_158);
      sVar11 = ::cm::operator____s("INPUT_MAY_BE_RECENT",0x13);
      pcVar9 = cmArgumentParser<Arguments>::Bind<bool>(&local_158,sVar11,0);
      sVar11 = ::cm::operator____s("ONLY_IF_DIFFERENT",0x11);
      this = (cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<Arguments>::Bind<bool>(pcVar9,sVar11,1);
      sVar11 = ::cm::operator____s("RESULT",6);
      pcVar9 = cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
               ::Bind<std::__cxx11::string>(this,sVar11,8);
      cmArgumentParser<Arguments>::cmArgumentParser(&HandleCopyFile::parser,pcVar9);
      cmArgumentParser<Arguments>::~cmArgumentParser(&local_158);
      __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleCopyFile::parser,
                   &__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&arguments.Result.field_2 + 8));
    local_1e8 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local);
    local_1d8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance(&local_1e8,3);
    cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((Arguments *)local_1c8,
               (cmArgumentParser<(anonymous_namespace)::HandleCopyFile(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&HandleCopyFile::parser,&local_1d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&arguments.Result.field_2 + 8),0);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&arguments.Result.field_2 + 8));
    pcVar1 = local_20;
    if (bVar2) {
      local_20d = 1;
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_78);
      if (bVar2) {
        uVar10 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        if ((uVar10 & 1) == 0) {
          pcVar7 = cmExecutionStatus::GetMakefile(local_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_220,"cannot copy a directory");
          cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_220);
        }
        else {
          cmStrCat<char_const(&)[37],std::__cxx11::string&>
                    (&local_240,(char (*) [37])"COPY_FILE cannot copy a directory\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
          cmExecutionStatus::SetError(pcVar1,&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          local_20d = 0;
        }
        args_local._7_1_ = local_20d & 1;
        local_20c = 1;
      }
      else {
        bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_c0);
        if (bVar2) {
          uVar10 = std::__cxx11::string::empty();
          pcVar1 = local_20;
          if ((uVar10 & 1) == 0) {
            pcVar7 = cmExecutionStatus::GetMakefile(local_20);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_250,"cannot copy to a directory");
            cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_250);
          }
          else {
            cmStrCat<char_const(&)[40],std::__cxx11::string&>
                      ((string *)&inputRecent,
                       (char (*) [40])"COPY_FILE cannot copy to a directory\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
            cmExecutionStatus::SetError(pcVar1,(string *)&inputRecent);
            std::__cxx11::string::~string((string *)&inputRecent);
            local_20d = 0;
          }
          args_local._7_1_ = local_20d & 1;
          local_20c = 1;
        }
        else {
          err.field_2._13_3_ = 0;
          err.field_2._M_local_buf[0xc] = (local_1c8[1] & 1U) != 0;
          err.field_2._8_4_ = local_1c8[0] & 1;
          std::__cxx11::string::string((string *)local_298);
          CVar4 = cmSystemTools::CopySingleFile
                            ((string *)local_78,(string *)local_c0,err.field_2._12_4_,
                             err.field_2._8_4_,(string *)local_298);
          if (CVar4 == Success) {
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              pcVar7 = cmExecutionStatus::GetMakefile(local_20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_2a8,"0");
              cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_2a8);
            }
          }
          else {
            uVar10 = std::__cxx11::string::empty();
            pcVar1 = local_20;
            if ((uVar10 & 1) == 0) {
              pcVar7 = cmExecutionStatus::GetMakefile(local_20);
              local_2b8 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_298);
              cmMakefile::AddDefinition(pcVar7,(string *)&arguments,local_2b8);
            }
            else {
              cmStrCat<char_const(&)[28],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                        (&local_2d8,(char (*) [28])"COPY_FILE failed to copy\n  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,(char (*) [7])"\nto\n  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0,(char (*) [11])"\nbecause: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,(char (*) [2])0x107b5a6);
              cmExecutionStatus::SetError(pcVar1,&local_2d8);
              std::__cxx11::string::~string((string *)&local_2d8);
              local_20d = 0;
            }
          }
          args_local._7_1_ = local_20d & 1;
          local_20c = 1;
          std::__cxx11::string::~string((string *)local_298);
        }
      }
    }
    else {
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&arguments.Result.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     "COPY_FILE unknown argument:\n  ",__rhs);
      cmExecutionStatus::SetError(pcVar1,(string *)local_208);
      std::__cxx11::string::~string((string *)local_208);
      args_local._7_1_ = 0;
      local_20c = 1;
    }
    HandleCopyFile::Arguments::~Arguments((Arguments *)local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&arguments.Result.field_2 + 8));
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleCopyFile(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("COPY_FILE must be called with at least two additional "
                    "arguments");
    return false;
  }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(oldname)) {
    oldname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }
  std::string newname = args[2];
  if (!cmsys::SystemTools::FileIsFullPath(newname)) {
    newname =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[2]);
  }

  struct Arguments
  {
    bool InputMayBeRecent = false;
    bool OnlyIfDifferent = false;
    std::string Result;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("INPUT_MAY_BE_RECENT"_s, &Arguments::InputMayBeRecent)
      .Bind("ONLY_IF_DIFFERENT"_s, &Arguments::OnlyIfDifferent)
      .Bind("RESULT"_s, &Arguments::Result);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);
  if (!unconsumedArgs.empty()) {
    status.SetError("COPY_FILE unknown argument:\n  " +
                    unconsumedArgs.front());
    return false;
  }

  bool result = true;
  if (cmsys::SystemTools::FileIsDirectory(oldname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy a directory\n  ", oldname));
      result = false;
    }
    return result;
  }
  if (cmsys::SystemTools::FileIsDirectory(newname)) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result,
                                         "cannot copy to a directory");
    } else {
      status.SetError(
        cmStrCat("COPY_FILE cannot copy to a directory\n  ", newname));
      result = false;
    }
    return result;
  }

  cmSystemTools::CopyWhen when;
  if (arguments.OnlyIfDifferent) {
    when = cmSystemTools::CopyWhen::OnlyIfDifferent;
  } else {
    when = cmSystemTools::CopyWhen::Always;
  }
  cmSystemTools::CopyInputRecent const inputRecent = arguments.InputMayBeRecent
    ? cmSystemTools::CopyInputRecent::Yes
    : cmSystemTools::CopyInputRecent::No;

  std::string err;
  if (cmSystemTools::CopySingleFile(oldname, newname, when, inputRecent,
                                    &err) ==
      cmSystemTools::CopyResult::Success) {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, "0");
    }
  } else {
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
    } else {
      status.SetError(cmStrCat("COPY_FILE failed to copy\n  ", oldname,
                               "\nto\n  ", newname, "\nbecause: ", err, "\n"));
      result = false;
    }
  }

  return result;
}